

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O0

vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> * __thiscall
QPDFAcroFormDocumentHelper::getAnnotationsForField
          (vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>
           *__return_storage_ptr__,QPDFAcroFormDocumentHelper *this,QPDFFormFieldObjectHelper *h)

{
  element_type *peVar1;
  size_type sVar2;
  mapped_type *__x;
  QPDFObjGen local_2c;
  QPDFObjGen og;
  QPDFFormFieldObjectHelper *h_local;
  QPDFAcroFormDocumentHelper *this_local;
  vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_> *result;
  
  unique0x1000011d = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)h;
  analyze(this);
  og.obj._3_1_ = 0;
  std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::vector
            (__return_storage_ptr__);
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&stack0xffffffffffffffc0);
  local_2c = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&stack0xffffffffffffffc0);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffc0);
  peVar1 = std::
           __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m);
  sVar2 = std::
          map<QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
          ::count(&peVar1->field_to_annotations,&stack0xffffffffffffffd4);
  if (sVar2 != 0) {
    peVar1 = std::
             __shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m);
    __x = std::
          map<QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
          ::operator[](&peVar1->field_to_annotations,&stack0xffffffffffffffd4);
    std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>::operator=
              (__return_storage_ptr__,__x);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFAnnotationObjectHelper>
QPDFAcroFormDocumentHelper::getAnnotationsForField(QPDFFormFieldObjectHelper h)
{
    analyze();
    std::vector<QPDFAnnotationObjectHelper> result;
    QPDFObjGen og(h.getObjectHandle().getObjGen());
    if (m->field_to_annotations.count(og)) {
        result = m->field_to_annotations[og];
    }
    return result;
}